

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O3

int __thiscall vector_bagwell<int,_16U>::operator[](vector_bagwell<int,_16U> *this,size_t index)

{
  pointer ppiVar1;
  pointer ppiVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  
  if ((this->_insertpos != (int *)0x0) &&
     (ppiVar1 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     ppiVar2 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
     index < (ulong)((long)this->_insertpos +
                     ((long)((1 << ((char)((uint)((int)ppiVar2 - (int)ppiVar1) >> 3) + 3U & 0x1f)) +
                            -0x10) * 4 - (long)ppiVar2[-1]) >> 2))) {
    uVar5 = index + 0x10;
    uVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    bVar4 = (byte)uVar3 & 0x1f;
    return ppiVar1[(uVar3 ^ 0x1fffffffffffffc0) + 0x3c]
           [(long)(int)(-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4) & uVar5];
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/vector_bagwell.h"
                ,0x46,"T vector_bagwell<int>::operator[](size_t) const [T = int, Initial = 16]");
}

Assistant:

bool empty() const { return _insertpos==0; }